

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_spatializer_config * ma_spatializer_config_init(ma_uint32 channelsIn,ma_uint32 channelsOut)

{
  ma_spatializer_config *in_RDI;
  
  if (in_RDI != (ma_spatializer_config *)0x0) {
    in_RDI->directionalAttenuationFactor = 0.0;
    in_RDI->minSpatializationChannelGain = 0.0;
    *(undefined8 *)&in_RDI->gainSmoothTimeInFrames = 0;
    in_RDI->coneInnerAngleInRadians = 0.0;
    in_RDI->coneOuterAngleInRadians = 0.0;
    in_RDI->coneOuterGain = 0.0;
    in_RDI->dopplerFactor = 0.0;
    in_RDI->maxGain = 0.0;
    in_RDI->minDistance = 0.0;
    in_RDI->maxDistance = 0.0;
    in_RDI->rolloff = 0.0;
    in_RDI->attenuationModel = ma_attenuation_model_none;
    in_RDI->positioning = ma_positioning_absolute;
    in_RDI->handedness = ma_handedness_right;
    in_RDI->minGain = 0.0;
    in_RDI->channelsIn = 0;
    in_RDI->channelsOut = 0;
    in_RDI->pChannelMapIn = (ma_channel *)0x0;
  }
  in_RDI->channelsIn = channelsIn;
  in_RDI->channelsOut = channelsOut;
  in_RDI->pChannelMapIn = (ma_channel *)0x0;
  in_RDI->attenuationModel = ma_attenuation_model_inverse;
  in_RDI->positioning = ma_positioning_absolute;
  in_RDI->handedness = ma_handedness_right;
  in_RDI->minGain = 0.0;
  in_RDI->maxGain = 1.0;
  in_RDI->minDistance = 1.0;
  in_RDI->maxDistance = 3.4028235e+38;
  in_RDI->rolloff = 1.0;
  in_RDI->coneInnerAngleInRadians = 6.283185;
  in_RDI->coneOuterAngleInRadians = 6.283185;
  in_RDI->coneOuterGain = 0.0;
  in_RDI->dopplerFactor = 1.0;
  in_RDI->directionalAttenuationFactor = 1.0;
  in_RDI->minSpatializationChannelGain = 0.2;
  in_RDI->gainSmoothTimeInFrames = 0x168;
  return in_RDI;
}

Assistant:

MA_API ma_spatializer_config ma_spatializer_config_init(ma_uint32 channelsIn, ma_uint32 channelsOut)
{
    ma_spatializer_config config;

    MA_ZERO_OBJECT(&config);
    config.channelsIn                   = channelsIn;
    config.channelsOut                  = channelsOut;
    config.pChannelMapIn                = NULL;
    config.attenuationModel             = ma_attenuation_model_inverse;
    config.positioning                  = ma_positioning_absolute;
    config.handedness                   = ma_handedness_right;
    config.minGain                      = 0;
    config.maxGain                      = 1;
    config.minDistance                  = 1;
    config.maxDistance                  = MA_FLT_MAX;
    config.rolloff                      = 1;
    config.coneInnerAngleInRadians      = 6.283185f; /* 360 degrees. */
    config.coneOuterAngleInRadians      = 6.283185f; /* 360 degrees. */
    config.coneOuterGain                = 0.0f;
    config.dopplerFactor                = 1;
    config.directionalAttenuationFactor = 1;
    config.minSpatializationChannelGain = 0.2f;
    config.gainSmoothTimeInFrames       = 360;       /* 7.5ms @ 48K. */

    return config;
}